

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O2

void reward_untrap(trap *ttmp,monst *mtmp)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  
  if (-1 < (char)ttmp->field_0x8) {
    iVar1 = rnl(10);
    if ((((iVar1 < 8) && ((*(uint *)&mtmp->field_0x60 & 0x480000) == 0)) && (mtmp->mfrozen == '\0'))
       && (((mtmp->data->mflags1 & 0x10000) == 0 && (mtmp->data->mlet != '5')))) {
      *(uint *)&mtmp->field_0x60 = *(uint *)&mtmp->field_0x60 | 0x400000;
      set_malign(mtmp);
      pcVar3 = Monnam(mtmp);
      pline("%s is grateful.",pcVar3);
    }
    uVar2 = mt_random();
    if (uVar2 % 3 == 0) {
      iVar1 = rnl(8);
      if ((iVar1 == 0) && (u.ualign.type == '\x01')) {
        adjalign(1);
        pline("You feel that you did the right thing.");
        return;
      }
    }
  }
  return;
}

Assistant:

static void reward_untrap(struct trap *ttmp, struct monst *mtmp)
{
	if (!ttmp->madeby_u) {
	    if (rnl(10) < 8 && !mtmp->mpeaceful &&
		    !mtmp->msleeping && !mtmp->mfrozen &&
		    !mindless(mtmp->data) &&
		    mtmp->data->mlet != S_HUMAN) {
		mtmp->mpeaceful = 1;
		set_malign(mtmp);	/* reset alignment */
		pline("%s is grateful.", Monnam(mtmp));
	    }
	    /* Helping someone out of a trap is a nice thing to do,
	     * A lawful may be rewarded, but not too often.  */
	    if (!rn2(3) && !rnl(8) && u.ualign.type == A_LAWFUL) {
		adjalign(1);
		pline("You feel that you did the right thing.");
	    }
	}
}